

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int check_password_digest
              (char *method,char *ha1,char *uri,char *nonce,char *nc,char *cnonce,char *qop,
              char *response)

{
  int iVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  uint uVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [16];
  char expected_response [33];
  char ha2 [33];
  
  auVar7._0_4_ = -(uint)(method == (char *)0x0);
  auVar7._4_4_ = -(uint)(nonce == (char *)0x0);
  auVar7._8_4_ = -(uint)(nc == (char *)0x0);
  auVar7._12_4_ = -(uint)(cnonce == (char *)0x0);
  iVar6 = movmskps((int)method,auVar7);
  uVar4 = 0;
  if ((response != (char *)0x0 && qop != (char *)0x0) && iVar6 == 0) {
    sVar2 = strlen(response);
    if (sVar2 == 0x20) {
      lVar5 = 0;
      mg_md5(ha2,method,":",uri,0);
      mg_md5(expected_response,ha1,":",nonce,":",nc,":",cnonce,":",qop,":",ha2,0);
      pp_Var3 = __ctype_tolower_loc();
      do {
        iVar6 = (*pp_Var3)[(byte)response[lVar5]];
        iVar1 = (*pp_Var3)[(byte)expected_response[lVar5]];
        if (response[lVar5] == 0) break;
        lVar5 = lVar5 + 1;
      } while (iVar6 == iVar1);
      uVar4 = (uint)(iVar6 == iVar1);
    }
  }
  return uVar4;
}

Assistant:

static int
check_password_digest(const char *method,
                      const char *ha1,
                      const char *uri,
                      const char *nonce,
                      const char *nc,
                      const char *cnonce,
                      const char *qop,
                      const char *response)
{
	char ha2[32 + 1], expected_response[32 + 1];

	/* Some of the parameters may be NULL */
	if ((method == NULL) || (nonce == NULL) || (nc == NULL) || (cnonce == NULL)
	    || (qop == NULL) || (response == NULL)) {
		return 0;
	}

	/* NOTE(lsm): due to a bug in MSIE, we do not compare the URI */
	if (strlen(response) != 32) {
		return 0;
	}

	mg_md5(ha2, method, ":", uri, NULL);
	mg_md5(expected_response,
	       ha1,
	       ":",
	       nonce,
	       ":",
	       nc,
	       ":",
	       cnonce,
	       ":",
	       qop,
	       ":",
	       ha2,
	       NULL);

	return mg_strcasecmp(response, expected_response) == 0;
}